

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O0

point_type __thiscall
plot::RealCanvas<plot::BrailleCanvas>::map(RealCanvas<plot::BrailleCanvas> *this,Pointf *p)

{
  float fVar1;
  long coord_x;
  long coord_y;
  GenericPoint<long> local_48;
  undefined1 local_38 [8];
  Size canvas_bounds;
  Pointf *p_local;
  RealCanvas<plot::BrailleCanvas> *this_local;
  
  canvas_bounds.y = (long)p;
  _local_38 = BrailleCanvas::size(&this->canvas_);
  GenericPoint<long>::GenericPoint(&local_48,1,1);
  GenericPoint<long>::operator-=((GenericPoint<long> *)local_38,&local_48);
  fVar1 = (this->bounds_).p1.x;
  coord_x = std::lround((double)(ulong)(uint)(((*(float *)canvas_bounds.y - fVar1) /
                                              ((this->bounds_).p2.x - fVar1)) *
                                             (float)(long)local_38));
  fVar1 = (this->bounds_).p1.y;
  coord_y = std::lround((double)(ulong)(uint)(((*(float *)(canvas_bounds.y + 4) - fVar1) /
                                              ((this->bounds_).p2.y - fVar1)) *
                                             (float)canvas_bounds.x));
  GenericPoint<long>::GenericPoint((GenericPoint<long> *)&this_local,coord_x,coord_y);
  return _this_local;
}

Assistant:

typename Canvas::point_type map(Pointf const& p) const {
        auto canvas_bounds = canvas_.size();
        canvas_bounds -= decltype(canvas_bounds){ 1, 1 };
        return {
            std::lround((p.x - bounds_.p1.x)/(bounds_.p2.x - bounds_.p1.x) * canvas_bounds.x),
            std::lround((p.y - bounds_.p1.y)/(bounds_.p2.y - bounds_.p1.y) * canvas_bounds.y)
        };
    }